

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O3

double S2::GetApproxArea(S2Shape *shape)

{
  int iVar1;
  size_type extraout_RDX;
  int chain_id;
  double dVar2;
  S2PointLoopSpan loop;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double local_50;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_48;
  
  iVar1 = (*shape->_vptr_S2Shape[4])();
  local_50 = 0.0;
  if (iVar1 == 2) {
    local_48.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = (*shape->_vptr_S2Shape[6])(shape);
    if (iVar1 < 1) {
      local_50 = 0.0;
    }
    else {
      local_50 = 0.0;
      chain_id = 0;
      do {
        GetChainVertices(shape,chain_id,&local_48);
        loop.super_S2PointSpan.ptr_ =
             (pointer)(((long)local_48.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        ;
        loop.super_S2PointSpan.len_ = extraout_RDX;
        dVar2 = GetApproxArea((S2 *)local_48.
                                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,loop);
        local_50 = local_50 + dVar2;
        chain_id = chain_id + 1;
      } while (iVar1 != chain_id);
      if (12.566370614359172 < local_50) {
        local_50 = fmod(local_50,12.566370614359172);
      }
    }
    if ((S2 *)local_48.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (S2 *)0x0) {
      operator_delete(local_48.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  return local_50;
}

Assistant:

double GetApproxArea(const S2Shape& shape) {
  if (shape.dimension() != 2) return 0.0;

  double area = 0;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    area += S2::GetApproxArea(S2PointLoopSpan(vertices));
  }
  // Special case to ensure that full polygons are handled correctly.
  if (area <= 4 * M_PI) return area;
  return fmod(area, 4 * M_PI);
}